

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O0

void __thiscall FScanner::OpenFile(FScanner *this,char *name)

{
  FString local_30;
  int local_24;
  BYTE *pBStack_20;
  int filesize;
  BYTE *filebuf;
  char *name_local;
  FScanner *this_local;
  
  filebuf = (BYTE *)name;
  name_local = (char *)this;
  Close(this);
  local_24 = M_ReadFile((char *)filebuf,&stack0xffffffffffffffe0);
  FString::FString(&local_30,(char *)pBStack_20,(long)local_24);
  FString::operator=(&this->ScriptBuffer,&local_30);
  FString::~FString(&local_30);
  if (pBStack_20 != (BYTE *)0x0) {
    operator_delete__(pBStack_20);
  }
  FString::operator=(&this->ScriptName,(char *)filebuf);
  this->LumpNum = -1;
  PrepareScript(this);
  return;
}

Assistant:

void FScanner::OpenFile (const char *name)
{
	BYTE *filebuf;
	int filesize;

	Close ();
	filesize = M_ReadFile (name, &filebuf);
	ScriptBuffer = FString((const char *)filebuf, filesize);
	delete[] filebuf;
	ScriptName = name;	// This is used for error messages so the full file name is preferable
	LumpNum = -1;
	PrepareScript ();
}